

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_segs.cpp
# Opt level: O0

void R_RenderFakeWall(drawseg_t *ds,int x1,int x2,F3DFloor *rover)

{
  SDWORD alpha;
  uint uVar1;
  ESPSResult EVar2;
  int iVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double planez;
  double rowoffset;
  side_t *psStack_50;
  ETexpart scaledpart;
  side_t *scaledside;
  ESPSResult drawmode;
  fixed_t Alpha;
  double yscale;
  double xscale;
  int i;
  F3DFloor *rover_local;
  int x2_local;
  int x1_local;
  drawseg_t *ds_local;
  
  alpha = Scale(rover->alpha,0x10000,0xff);
  uVar1 = 6;
  if ((rover->flags & 0x10000000) != 0) {
    uVar1 = 7;
  }
  EVar2 = R_SetPatchStyle(LegacyRenderStyles[uVar1],alpha,0,0);
  if (EVar2 == DontDraw) {
    R_FinishSetPatchStyle();
  }
  else {
    rw_lightstep = ds->lightstep;
    rw_light = ds->light + (float)(x1 - ds->x1) * rw_lightstep;
    mfloorclip = openings + (ds->sprbottomclip - (long)(int)ds->x1);
    mceilingclip = openings + (ds->sprtopclip - (long)(int)ds->x1);
    spryscale = (double)(ds->iscale + ds->iscalestep * (float)(x1 - ds->x1));
    rw_scalestep = (double)ds->iscalestep;
    MaskedSWall = (float *)(openings + ds->swall + (long)(int)ds->x1 * -2);
    if ((rover->flags & 0x20000) == 0) {
      if ((rover->flags & 0x40000) == 0) {
        psStack_50 = rover->master->sidedef[0];
        rowoffset._4_4_ = 1;
      }
      else {
        psStack_50 = curline->sidedef;
        rowoffset._4_4_ = 2;
      }
    }
    else {
      psStack_50 = curline->sidedef;
      rowoffset._4_4_ = 0;
    }
    dVar5 = (rw_pic->Scale).X;
    dVar4 = side_t::GetTextureXScale(psStack_50,rowoffset._4_4_);
    dVar5 = dVar5 * dVar4;
    dVar4 = (rw_pic->Scale).Y;
    dVar6 = side_t::GetTextureYScale(psStack_50,rowoffset._4_4_);
    dVar4 = dVar4 * dVar6;
    dVar6 = side_t::GetTextureYOffset(curline->sidedef,1);
    dVar7 = side_t::GetTextureYOffset(rover->master->sidedef[0],1);
    planez = dVar6 + dVar7;
    dVar6 = sector_t::GetPlaneTexZ(rover->model,1);
    dVar7 = side_t::GetTextureXOffset(curline->sidedef,1);
    dVar8 = side_t::GetTextureXOffset(rover->master->sidedef[0],1);
    rw_offset = FloatToFixed(dVar7 + dVar8);
    if (planez < 0.0) {
      iVar3 = FTexture::GetHeight(rw_pic);
      planez = (double)iVar3 + planez;
    }
    dVar6 = (dVar6 - ViewPos.Z) * dVar4;
    if ((*(ushort *)&rw_pic->field_0x31 >> 2 & 1) == 0) {
      dc_texturemid = planez + dVar6;
    }
    else {
      dc_texturemid = dVar6 + planez * dVar4;
      rw_offset = xs_RoundToInt((real64)((double)rw_offset * dVar5));
    }
    if (fixedlightlev < 0) {
      if (fixedcolormap != (lighttable_t *)0x0) {
        dc_colormap = fixedcolormap;
      }
    }
    else {
      dc_colormap = basecolormap->Maps + fixedlightlev;
    }
    WallC.sz1 = ds->sz1;
    WallC.sz2 = ds->sz2;
    WallC.sx1 = ds->sx1;
    WallC.sx2 = ds->sx2;
    WallC.tleft.X = ds->cx;
    WallC.tleft.Y = ds->cy;
    WallC.tright.X = ds->cx + ds->cdx;
    WallC.tright.Y = ds->cy + ds->cdy;
    WallT.UoverZorg = (ds->tmapvals).UoverZorg;
    WallT.UoverZstep = (ds->tmapvals).UoverZstep;
    WallT.InvZorg = (ds->tmapvals).InvZorg;
    WallT.InvZstep = (ds->tmapvals).InvZstep;
    OWallMost(wallupper,sclipTop - ViewPos.Z,&WallC);
    OWallMost(walllower,sclipBottom - ViewPos.Z,&WallC);
    for (xscale._4_4_ = x1; iVar3 = x1, xscale._4_4_ < x2; xscale._4_4_ = xscale._4_4_ + 1) {
      if (wallupper[xscale._4_4_] < mceilingclip[xscale._4_4_]) {
        wallupper[xscale._4_4_] = mceilingclip[xscale._4_4_];
      }
    }
    while (xscale._4_4_ = iVar3, xscale._4_4_ < x2) {
      if (mfloorclip[xscale._4_4_] < walllower[xscale._4_4_]) {
        walllower[xscale._4_4_] = mfloorclip[xscale._4_4_];
      }
      iVar3 = xscale._4_4_ + 1;
    }
    PrepLWall(lwall,(double)curline->sidedef->TexelLength * dVar5,(int)ds->sx1,(int)ds->sx2);
    wallscan_np2_ds(ds,x1,x2,wallupper,walllower,MaskedSWall,lwall,dVar4);
    R_FinishSetPatchStyle();
  }
  return;
}

Assistant:

void R_RenderFakeWall(drawseg_t *ds, int x1, int x2, F3DFloor *rover)
{
	int i;
	double xscale;
	double yscale;

	fixed_t Alpha = Scale(rover->alpha, OPAQUE, 255);
	ESPSResult drawmode;
	drawmode = R_SetPatchStyle (LegacyRenderStyles[rover->flags & FF_ADDITIVETRANS ? STYLE_Add : STYLE_Translucent],
		Alpha, 0, 0);

	if(drawmode == DontDraw) {
		R_FinishSetPatchStyle();
		return;
	}

	rw_lightstep = ds->lightstep;
	rw_light = ds->light + (x1 - ds->x1) * rw_lightstep;

	mfloorclip = openings + ds->sprbottomclip - ds->x1;
	mceilingclip = openings + ds->sprtopclip - ds->x1;

	spryscale = ds->iscale + ds->iscalestep * (x1 - ds->x1);
	rw_scalestep = ds->iscalestep;
	MaskedSWall = (float *)(openings + ds->swall) - ds->x1;

	// find positioning
	side_t *scaledside;
	side_t::ETexpart scaledpart;
	if (rover->flags & FF_UPPERTEXTURE)
	{
		scaledside = curline->sidedef;
		scaledpart = side_t::top;
	}
	else if (rover->flags & FF_LOWERTEXTURE)
	{
		scaledside = curline->sidedef;
		scaledpart = side_t::bottom;
	}
	else
	{
		scaledside = rover->master->sidedef[0];
		scaledpart = side_t::mid;
	}
	xscale = rw_pic->Scale.X * scaledside->GetTextureXScale(scaledpart);
	yscale = rw_pic->Scale.Y * scaledside->GetTextureYScale(scaledpart);

	double rowoffset = curline->sidedef->GetTextureYOffset(side_t::mid) + rover->master->sidedef[0]->GetTextureYOffset(side_t::mid);
	double planez = rover->model->GetPlaneTexZ(sector_t::ceiling);
	rw_offset = FLOAT2FIXED(curline->sidedef->GetTextureXOffset(side_t::mid) + rover->master->sidedef[0]->GetTextureXOffset(side_t::mid));
	if (rowoffset < 0)
	{
		rowoffset += rw_pic->GetHeight();
	}
	dc_texturemid = (planez - ViewPos.Z) * yscale;
	if (rw_pic->bWorldPanning)
	{
		// rowoffset is added before the multiply so that the masked texture will
		// still be positioned in world units rather than texels.

		dc_texturemid = dc_texturemid + rowoffset * yscale;
		rw_offset = xs_RoundToInt(rw_offset * xscale);
	}
	else
	{
		// rowoffset is added outside the multiply so that it positions the texture
		// by texels instead of world units.
		dc_texturemid += rowoffset;
	}

	if (fixedlightlev >= 0)
		dc_colormap = basecolormap->Maps + fixedlightlev;
	else if (fixedcolormap != NULL)
		dc_colormap = fixedcolormap;

	WallC.sz1 = ds->sz1;
	WallC.sz2 = ds->sz2;
	WallC.sx1 = ds->sx1;
	WallC.sx2 = ds->sx2;
	WallC.tleft.X = ds->cx;
	WallC.tleft.Y = ds->cy;
	WallC.tright.X = ds->cx + ds->cdx;
	WallC.tright.Y = ds->cy + ds->cdy;
	WallT = ds->tmapvals;

	OWallMost(wallupper, sclipTop - ViewPos.Z, &WallC);
	OWallMost(walllower, sclipBottom - ViewPos.Z, &WallC);

	for (i = x1; i < x2; i++)
	{
		if (wallupper[i] < mceilingclip[i])
			wallupper[i] = mceilingclip[i];
	}
	for (i = x1; i < x2; i++)
	{
		if (walllower[i] > mfloorclip[i])
			walllower[i] = mfloorclip[i];
	}

	PrepLWall (lwall, curline->sidedef->TexelLength*xscale, ds->sx1, ds->sx2);
	wallscan_np2_ds(ds, x1, x2, wallupper, walllower, MaskedSWall, lwall, yscale);
	R_FinishSetPatchStyle();
}